

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O1

int ipcmd_recv_tcp(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  YPSpur_msg *pYVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ssize_t sVar7;
  ulong uVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  bool bVar12;
  uint addr_size;
  sockaddr_in client;
  fd_set fds;
  socklen_t local_d4;
  YPSpur_msg *local_d0;
  undefined1 local_c8 [16];
  fd_set local_b8;
  
  uVar5 = 0xffffffff;
  if ((ipcmd != (ipcmd_t *)0x0) && (ipcmd->connection_error == 0)) {
    local_d0 = data;
    do {
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      iVar3 = ipcmd->socket;
      iVar2 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      iVar9 = 0;
      if (0 < iVar3) {
        iVar9 = iVar3;
      }
      local_b8.fds_bits[iVar2 >> 6] =
           local_b8.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
      lVar6 = 0;
      do {
        iVar3 = ipcmd->clients[lVar6];
        iVar2 = iVar9;
        if (iVar3 != -1) {
          iVar2 = iVar3 + 0x3f;
          if (-1 < iVar3) {
            iVar2 = iVar3;
          }
          local_b8.fds_bits[iVar2 >> 6] = local_b8.fds_bits[iVar2 >> 6] | 1L << ((byte)iVar3 & 0x3f)
          ;
          iVar2 = iVar3;
          if (iVar3 < iVar9) {
            iVar2 = iVar9;
          }
        }
        iVar9 = iVar2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      iVar3 = select(iVar9 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (iVar3 == 0) {
        yprintf(OUTPUT_LV_ERROR,"Couldn\'t select the socket.\n");
        cVar10 = '\x01';
        uVar11 = 0x40;
      }
      else {
        uVar5 = ipcmd->socket;
        uVar4 = uVar5 + 0x3f;
        if (-1 < (int)uVar5) {
          uVar4 = uVar5;
        }
        cVar10 = '\x05';
        uVar11 = 0x40;
        if ((((ulong)local_b8.fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0) &&
           (ipcmd->tcp_type != IPCMD_TCP_CLIENT)) {
          local_d4 = 0x10;
          iVar3 = accept(uVar5,(sockaddr *)local_c8,&local_d4);
          if (iVar3 < 1) {
            yprintf(OUTPUT_LV_ERROR,"Invalid socket.\n");
            cVar10 = '\x01';
          }
          else {
            uVar8 = 0;
            do {
              if (ipcmd->clients[uVar8] == -1) goto LAB_0010a76b;
              uVar8 = uVar8 + 1;
            } while (uVar8 != 0x40);
            uVar8 = 0x40;
LAB_0010a76b:
            bVar12 = (int)uVar8 != 0x40;
            if (bVar12) {
              ipcmd->clients[uVar8 & 0xffffffff] = iVar3;
              inet_ntoa((in_addr)local_c8._4_4_);
              yprintf(OUTPUT_LV_INFO,"Connection %d accepted from %s.\n",uVar8 & 0xffffffff);
              uVar11 = uVar8 & 0xffffffff;
            }
            else {
              yprintf(OUTPUT_LV_ERROR,"Too many connection requests.\n");
            }
            cVar10 = !bVar12;
          }
        }
      }
      pYVar1 = local_d0;
    } while (cVar10 == '\0');
    if (cVar10 == '\x05') {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT) {
        uVar5 = ipcmd->socket;
        uVar8 = 0;
LAB_0010a849:
        sVar7 = recv(uVar5,local_d0,0x38,0);
        pYVar1->pid = uVar8;
        bVar12 = (int)sVar7 < 1;
      }
      else {
        uVar8 = 0;
        do {
          uVar5 = ipcmd->clients[uVar8];
          uVar4 = uVar5 + 0x3f;
          if (-1 < (int)uVar5) {
            uVar4 = uVar5;
          }
          if (((ulong)local_b8.fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
            uVar11 = uVar8 & 0xffffffff;
            goto LAB_0010a849;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0x40);
        bVar12 = true;
        uVar11 = 0x40;
      }
      cVar10 = '\0';
      if (bVar12) {
        if (ipcmd->tcp_type == IPCMD_TCP_CLIENT) {
          yprintf(OUTPUT_LV_INFO,"Connection closed.\n");
          ipcmd->connection_error = 1;
          shutdown(ipcmd->socket,2);
          cVar10 = '\x01';
        }
        else {
          yprintf(OUTPUT_LV_INFO,"Connection %d closed.\n",uVar11);
          ipcmd->clients[(int)uVar11] = -1;
          cVar10 = '\x03';
        }
      }
    }
    uVar5 = -(uint)(cVar10 != '\x03' && cVar10 != '\0') | 0x38;
  }
  return uVar5;
}

Assistant:

int ipcmd_recv_tcp(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  fd_set fds;
  struct sockaddr_in client;
  int sock;
  int i;
  size_t len = sizeof(YPSpur_msg);

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  do
  {
    int recved;
    while (1)
    {
      SIZE_TYPE addr_size;
      int nfds = 0;

      FD_ZERO(&fds);
      FD_SET(ipcmd->socket, &fds);
      if (nfds < ipcmd->socket)
        nfds = ipcmd->socket;
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] != -1)
        {
          FD_SET(ipcmd->clients[i], &fds);
          if (nfds < ipcmd->clients[i])
            nfds = ipcmd->clients[i];
        }
      }

      nfds++;
      if (!select(nfds, &fds, NULL, NULL, NULL))
      {
        yprintf(OUTPUT_LV_ERROR, "Couldn't select the socket.\n");
        return -1;
      }
      if (!FD_ISSET(ipcmd->socket, &fds))
      {
        break;
      }
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        break;
      }

      addr_size = sizeof(client);
      sock = accept(ipcmd->socket, (struct sockaddr*)&client, &addr_size);
      if (sock <= 0)
      {
        yprintf(OUTPUT_LV_ERROR, "Invalid socket.\n");
        return -1;
      }
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (ipcmd->clients[i] == -1)
        {
          break;
        }
      }
      if (i == YPSPUR_MAX_SOCKET)
      {
        yprintf(OUTPUT_LV_ERROR, "Too many connection requests.\n");
        return -1;
      }
      ipcmd->clients[i] = sock;
      yprintf(OUTPUT_LV_INFO, "Connection %d accepted from %s.\n", i, inet_ntoa(client.sin_addr));
    }

    recved = -1;
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
    {
      recved = recv(ipcmd->socket, (SOCK_DATATYPE)data, len, 0);
      data->pid = 0;
    }
    else
    {
      for (i = 0; i < YPSPUR_MAX_SOCKET; i++)
      {
        if (FD_ISSET(ipcmd->clients[i], &fds))
        {
          recved = recv(ipcmd->clients[i], (SOCK_DATATYPE)data, len, 0);
          data->pid = i;
          break;
        }
      }
    }
    if (recved <= 0)
    {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
      {
        yprintf(OUTPUT_LV_INFO, "Connection closed.\n");
        ipcmd->connection_error = 1;
        shutdown(ipcmd->socket, SOCK_SHUTDOWN_OPTION);
        return -1;
      }
      yprintf(OUTPUT_LV_INFO, "Connection %d closed.\n", i);
      ipcmd->clients[i] = -1;
      continue;
    }
  }
  while (0);
  return len;
}